

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O1

void __thiscall icu_63::CalendarAstronomer::setTime(CalendarAstronomer *this,UDate aTime)

{
  double dVar1;
  
  this->fTime = aTime;
  dVar1 = uprv_getNaN_63();
  this->julianDay = dVar1;
  this->julianCentury = dVar1;
  this->sunLongitude = dVar1;
  this->meanAnomalySun = dVar1;
  this->moonLongitude = dVar1;
  this->moonEclipLong = dVar1;
  this->meanAnomalyMoon = dVar1;
  this->eclipObliquity = dVar1;
  this->siderealTime = dVar1;
  this->siderealT0 = dVar1;
  this->moonPositionSet = '\0';
  return;
}

Assistant:

void CalendarAstronomer::setTime(UDate aTime) {
    fTime = aTime;
    U_DEBUG_ASTRO_MSG(("setTime(%.1lf, %sL)\n", aTime, debug_astro_date(aTime+fGmtOffset)));
    clearCache();
}